

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O1

char * canonify(char *name)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  sftp_request *psVar6;
  sftp_packet *psVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  int iVar13;
  
  pcVar4 = pwd;
  if (*name == '/') {
    pcVar4 = dupstr(name);
  }
  else {
    sVar5 = strlen(pwd);
    pcVar8 = "/";
    if (pcVar4[sVar5 - 1] == '/') {
      pcVar8 = anon_var_dwarf_34f89 + 10;
    }
    pcVar4 = dupcat_fn(pcVar4,pcVar8,name,0);
  }
  psVar6 = fxp_realpath_send(pcVar4);
  psVar7 = sftp_wait_for_reply(psVar6);
  pcVar8 = fxp_realpath_recv(psVar7,psVar6);
  if (pcVar8 == (char *)0x0) {
    uVar9 = strlen(pcVar4);
    iVar13 = (int)uVar9;
    if ((2 < iVar13) && (pcVar4[iVar13 - 1] == '/')) {
      uVar9 = (ulong)(iVar13 - 1);
      pcVar4[uVar9] = '\0';
    }
    if (0 < (int)uVar9) {
      uVar10 = uVar9 & 0xffffffff;
      do {
        uVar9 = uVar10 - 1;
        if ((long)uVar10 < 2) break;
        lVar1 = uVar10 - 1;
        uVar10 = uVar9;
      } while (pcVar4[lVar1] != '/');
    }
    iVar13 = (int)uVar9;
    if (pcVar4[iVar13] == '/') {
      pcVar8 = pcVar4 + iVar13;
      iVar3 = strcmp(pcVar8,"/.");
      if (((iVar3 != 0) && (iVar3 = strcmp(pcVar8,"/.."), iVar3 != 0)) &&
         (iVar3 = strcmp(pcVar4,"/"), iVar3 != 0)) {
        *pcVar8 = '\0';
        pcVar11 = pcVar4;
        if (iVar13 == 0) {
          pcVar11 = "/";
        }
        psVar6 = fxp_realpath_send(pcVar11);
        psVar7 = sftp_wait_for_reply(psVar6);
        pcVar11 = fxp_realpath_recv(psVar7,psVar6);
        if (pcVar11 == (char *)0x0) {
          *pcVar8 = '/';
        }
        else {
          _Var2 = strendswith(pcVar11,"/");
          pcVar12 = anon_var_dwarf_34f89 + 10;
          if (!_Var2) {
            pcVar12 = "/";
          }
          pcVar8 = dupcat_fn(pcVar11,pcVar12,pcVar8 + 1,0);
          safefree(pcVar4);
          safefree(pcVar11);
          pcVar4 = pcVar8;
        }
      }
    }
  }
  else {
    safefree(pcVar4);
    pcVar4 = pcVar8;
  }
  return pcVar4;
}

Assistant:

char *canonify(const char *name)
{
    char *fullname, *canonname;
    struct sftp_packet *pktin;
    struct sftp_request *req;

    if (name[0] == '/') {
        fullname = dupstr(name);
    } else {
        const char *slash;
        if (pwd[strlen(pwd) - 1] == '/')
            slash = "";
        else
            slash = "/";
        fullname = dupcat(pwd, slash, name);
    }

    req = fxp_realpath_send(fullname);
    pktin = sftp_wait_for_reply(req);
    canonname = fxp_realpath_recv(pktin, req);

    if (canonname) {
        sfree(fullname);
        return canonname;
    } else {
        /*
         * Attempt number 2. Some FXP_REALPATH implementations
         * (glibc-based ones, in particular) require the _whole_
         * path to point to something that exists, whereas others
         * (BSD-based) only require all but the last component to
         * exist. So if the first call failed, we should strip off
         * everything from the last slash onwards and try again,
         * then put the final component back on.
         *
         * Special cases:
         *
         *  - if the last component is "/." or "/..", then we don't
         *    bother trying this because there's no way it can work.
         *
         *  - if the thing actually ends with a "/", we remove it
         *    before we start. Except if the string is "/" itself
         *    (although I can't see why we'd have got here if so,
         *    because surely "/" would have worked the first
         *    time?), in which case we don't bother.
         *
         *  - if there's no slash in the string at all, give up in
         *    confusion (we expect at least one because of the way
         *    we constructed the string).
         */

        int i;
        char *returnname;

        i = strlen(fullname);
        if (i > 2 && fullname[i - 1] == '/')
            fullname[--i] = '\0';      /* strip trailing / unless at pos 0 */
        while (i > 0 && fullname[--i] != '/');

        /*
         * Give up on special cases.
         */
        if (fullname[i] != '/' ||      /* no slash at all */
            !strcmp(fullname + i, "/.") ||      /* ends in /. */
            !strcmp(fullname + i, "/..") ||     /* ends in /.. */
            !strcmp(fullname, "/")) {
            return fullname;
        }

        /*
         * Now i points at the slash. Deal with the final special
         * case i==0 (ie the whole path was "/nonexistentfile").
         */
        fullname[i] = '\0';            /* separate the string */
        if (i == 0) {
            req = fxp_realpath_send("/");
        } else {
            req = fxp_realpath_send(fullname);
        }
        pktin = sftp_wait_for_reply(req);
        canonname = fxp_realpath_recv(pktin, req);

        if (!canonname) {
            /* Even that failed. Restore our best guess at the
             * constructed filename and give up */
            fullname[i] = '/';  /* restore slash and last component */
            return fullname;
        }

        /*
         * We have a canonical name for all but the last path
         * component. Concatenate the last component and return.
         */
        returnname = dupcat(canonname,
                            (strendswith(canonname, "/") ? "" : "/"),
                            fullname + i + 1);
        sfree(fullname);
        sfree(canonname);
        return returnname;
    }
}